

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<long,_long,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<long,_long,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          long *key,long *value)

{
  long lVar1;
  HeapEntry<long> HVar2;
  ulong __holeIndex;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_> *__first;
  HeapEntry<long> HVar3;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_> __value;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_> __value_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_>_&)>
  local_20;
  
  __first = this->heap;
  __holeIndex = this->size;
  if (__holeIndex < this->capacity) {
    __first[__holeIndex].first.value = *key;
    __first[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    HVar2.value = __first[__holeIndex].first.value;
    HVar3.value = __first[__holeIndex].second.value;
  }
  else {
    HVar2.value = *key;
    lVar1 = (__first->first).value;
    if (HVar2.value <= lVar1) {
      return;
    }
    if (1 < (long)__holeIndex) {
      HVar2.value = __first[__holeIndex - 1].first.value;
      HVar3.value = __first[__holeIndex - 1].second.value;
      __first[__holeIndex - 1].first.value = lVar1;
      __first[__holeIndex - 1].second.value = (__first->second).value;
      __value.second.value = HVar3.value;
      __value.first.value = HVar2.value;
      std::
      __adjust_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<long>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<long>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<long>>const&)>>
                (__first,0,(long)(__holeIndex * 0x10 + -0x10) >> 4,__value,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<long>_>_&)>
                  )Compare);
      __first = this->heap;
      __holeIndex = this->size;
      HVar2.value = *key;
    }
    __first[__holeIndex - 1].first.value = HVar2.value;
    HVar3.value = *value;
    __first[__holeIndex - 1].second.value = HVar3.value;
    __holeIndex = ((long)(__holeIndex * 0x10) >> 4) - 1;
  }
  local_20._M_comp = Compare;
  __value_00.second.value = HVar3.value;
  __value_00.first.value = HVar2.value;
  std::
  __push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<long>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<long>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<long>>const&)>>
            (__first,__holeIndex,0,__value_00,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}